

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack1_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 2 | *out;
  *out = (in[2] - base) * 4 | *out;
  *out = (in[3] - base) * 8 | *out;
  *out = (in[4] - base) * 0x10 | *out;
  *out = (in[5] - base) * 0x20 | *out;
  *out = (in[6] - base) * 0x40 | *out;
  *out = (in[7] - base) * 0x80 | *out;
  *out = (in[8] - base) * 0x100 | *out;
  *out = (in[9] - base) * 0x200 | *out;
  *out = (in[10] - base) * 0x400 | *out;
  *out = (in[0xb] - base) * 0x800 | *out;
  *out = (in[0xc] - base) * 0x1000 | *out;
  *out = (in[0xd] - base) * 0x2000 | *out;
  *out = (in[0xe] - base) * 0x4000 | *out;
  *out = (in[0xf] - base) * 0x8000 | *out;
  return out + 1;
}

Assistant:

uint32_t * pack1_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  1 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  3 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  15 ;
    ++in;

    return out + 1;
}